

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendDecimalValueInternal<duckdb::date_t,duckdb::hugeint_t>
          (BaseAppender *this,Vector *col,date_t input)

{
  InternalException *this_00;
  Vector *in_RSI;
  long in_RDI;
  hugeint_t *result;
  CastParameters parameters;
  uint8_t scale;
  uint8_t width;
  LogicalType *type;
  string *in_stack_ffffffffffffff38;
  CastParameters *in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff63;
  undefined4 in_stack_ffffffffffffff64;
  BaseAppender *in_stack_ffffffffffffff68;
  date_t in_stack_ffffffffffffff74;
  string local_88 [6];
  uint8_t in_stack_ffffffffffffff7e;
  uint8_t in_stack_ffffffffffffff7f;
  CastParameters *in_stack_ffffffffffffff80;
  hugeint_t *in_stack_ffffffffffffff88;
  date_t in_stack_ffffffffffffff94;
  
  if (*(char *)(in_RDI + 0x90) == '\0') {
    Vector::GetType(in_RSI);
    DecimalType::GetWidth((LogicalType *)in_stack_ffffffffffffff40);
    DecimalType::GetScale((LogicalType *)in_stack_ffffffffffffff40);
    CastParameters::CastParameters(in_stack_ffffffffffffff40);
    FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x9497d0);
    DataChunk::size((DataChunk *)(in_RDI + 0x48));
    TryCastToDecimal::Operation<duckdb::date_t,duckdb::hugeint_t>
              (in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e);
  }
  else {
    if (*(char *)(in_RDI + 0x90) != '\x01') {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_88,"Type not implemented for AppenderType",
                 (allocator *)&stack0xffffffffffffff77);
      InternalException::InternalException(this_00,in_stack_ffffffffffffff38);
      __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
    }
    AppendValueInternal<duckdb::date_t,duckdb::hugeint_t>
              (in_stack_ffffffffffffff68,
               (Vector *)
               CONCAT44(in_stack_ffffffffffffff64,
                        CONCAT13(in_stack_ffffffffffffff63,CONCAT12(1,in_stack_ffffffffffffff60))),
               in_stack_ffffffffffffff74);
  }
  return;
}

Assistant:

void BaseAppender::AppendDecimalValueInternal(Vector &col, SRC input) {
	switch (appender_type) {
	case AppenderType::LOGICAL: {
		auto &type = col.GetType();
		D_ASSERT(type.id() == LogicalTypeId::DECIMAL);
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		CastParameters parameters;
		auto &result = FlatVector::GetData<DST>(col)[chunk.size()];
		TryCastToDecimal::Operation<SRC, DST>(input, result, parameters, width, scale);
		return;
	}
	case AppenderType::PHYSICAL: {
		AppendValueInternal<SRC, DST>(col, input);
		return;
	}
	default:
		throw InternalException("Type not implemented for AppenderType");
	}
}